

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void copy_block(deflate_state *s,charf *buf,uint len,int header)

{
  Bytef BVar1;
  uint uVar2;
  byte bVar3;
  uint local_1c;
  int header_local;
  uint len_local;
  charf *buf_local;
  deflate_state *s_local;
  
  bi_windup(s);
  s->last_eob_len = 8;
  local_1c = len;
  _header_local = (Bytef *)buf;
  if (header != 0) {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (byte)len;
    bVar3 = (byte)(len >> 8);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = bVar3;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (byte)len ^ 0xff;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = bVar3 ^ 0xff;
  }
  while (local_1c != 0) {
    BVar1 = *_header_local;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = BVar1;
    local_1c = local_1c - 1;
    _header_local = _header_local + 1;
  }
  return;
}

Assistant:

local void copy_block(s, buf, len, header)
    deflate_state *s;
    charf    *buf;    /* the input data */
    unsigned len;     /* its length */
    int      header;  /* true if block header must be written */
{
    bi_windup(s);        /* align on byte boundary */
    s->last_eob_len = 8; /* enough lookahead for inflate */

    if (header) {
        put_short(s, (ush)len);
        put_short(s, (ush)~len);
#ifdef DEBUG
        s->bits_sent += 2*16;
#endif
    }
#ifdef DEBUG
    s->bits_sent += (ulg)len<<3;
#endif
    while (len--) {
        put_byte(s, *buf++);
    }
}